

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::segmentcheckReverse(string *unit,char closeSegment,int *index)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char current;
  int *index_local;
  char closeSegment_local;
  string *unit_local;
  
  iVar1 = *index;
  iVar4 = std::__cxx11::string::size();
  if (iVar1 < iVar4) {
LAB_001b5f5d:
    do {
      while( true ) {
        if (*index < 0) {
          return false;
        }
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit);
        cVar2 = *pcVar5;
        *index = *index + -1;
        if ((*index < 0) ||
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit), *pcVar5 != '\\')) break;
        *index = *index + -1;
      }
      if (cVar2 == closeSegment) {
        return true;
      }
      if (cVar2 == '(') {
        return false;
      }
      if (cVar2 != ')') {
        if (cVar2 == '[') {
          return false;
        }
        if (cVar2 != ']') {
          if (cVar2 == '{') {
            return false;
          }
          if (cVar2 != '}') goto LAB_001b5f5d;
        }
      }
      cVar2 = getMatchCharacter(cVar2);
      bVar3 = segmentcheckReverse(unit,cVar2,index);
    } while (bVar3);
  }
  return false;
}

Assistant:

static bool
    segmentcheckReverse(const std::string& unit, char closeSegment, int& index)
{
    if (index >= static_cast<int>(unit.size())) {
        // LCOV_EXCL_START
        return false;
        // LCOV_EXCL_STOP
    }
    while (index >= 0) {
        char current = unit[index];
        --index;
        if (index >= 0 && unit[index] == '\\') {
            --index;
            continue;
        }
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '}':
            case ')':
            case ']':
                if (!segmentcheckReverse(
                        unit, getMatchCharacter(current), index)) {
                    // LCOV_EXCL_START
                    return false;
                    // LCOV_EXCL_STOP
                }
                break;
            case '{':
            case '(':
            case '[':
                return false;
            default:
                break;
        }
    }
    // LCOV_EXCL_START
    return false;
    // LCOV_EXCL_STOP
}